

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfileio.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readBasisFile(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,char *filename,NameSet *rowNames,NameSet *colNames)

{
  int iVar1;
  undefined1 uVar2;
  allocator local_359;
  string local_358;
  spxifstream file;
  
  std::__cxx11::string::string((string *)&local_358,filename,&local_359);
  zstr::ifstream::ifstream(&file,&local_358,_S_in,0x100000);
  std::__cxx11::string::~string((string *)&local_358);
  if (((&file.super_istream.field_0x20)[(long)file.super_istream._vptr_basic_istream[-3]] & 5) == 0)
  {
    iVar1 = (*(this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxBasisBase[1])
                      (&this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,&file,rowNames,colNames);
    uVar2 = (undefined1)iVar1;
  }
  else {
    uVar2 = 0;
  }
  zstr::ifstream::~ifstream(&file);
  return (bool)uVar2;
}

Assistant:

bool SPxSolverBase<R>::readBasisFile(
   const char*    filename,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   spxifstream file(filename);

   if(!file)
      return false;

   return this->readBasis(file, rowNames, colNames);
}